

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

int __thiscall QCss::Declaration::styleFeaturesValue(Declaration *this)

{
  int iVar1;
  quint64 qVar2;
  uint uVar3;
  DeclarationData *pDVar4;
  ulong i;
  long in_FS_OFFSET;
  QString local_78;
  Value local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->d).d.ptr;
  if (*(ulong *)&(pDVar4->parsed).d.field_0x18 < 4) {
    if ((pDVar4->values).d.size == 0) {
      uVar3 = 0;
    }
    else {
      i = 0;
      uVar3 = 0;
      do {
        QList<QCss::Value>::value(&local_60,&pDVar4->values,i);
        ::QVariant::toString();
        qVar2 = findKnownValue(&local_78,styleFeatures,4);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        uVar3 = uVar3 | (uint)qVar2;
        ::QVariant::~QVariant(&local_60.variant);
        i = i + 1;
        pDVar4 = (this->d).d.ptr;
      } while (i < (ulong)(pDVar4->values).d.size);
    }
    ::QVariant::QVariant((QVariant *)&local_60,uVar3);
    ::QVariant::operator=(&((this->d).d.ptr)->parsed,(QVariant *)&local_60);
    ::QVariant::~QVariant((QVariant *)&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return uVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    iVar1 = ::QVariant::toInt((bool *)&pDVar4->parsed);
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int Declaration::styleFeaturesValue() const
{
    Q_ASSERT(d->propertyId == QtStyleFeatures);
    if (d->parsed.isValid())
        return d->parsed.toInt();
    int features = StyleFeature_None;
    for (int i = 0; i < d->values.size(); i++) {
        features |= static_cast<int>(findKnownValue(d->values.value(i).variant.toString(),
                                     styleFeatures, NumKnownStyleFeatures));
    }
    d->parsed = features;
    return features;
}